

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  data;
  GLenum GVar1;
  deBool dVar2;
  int iVar3;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *this_00;
  Pipeline *this_01;
  ProgramPipeline *this_02;
  ProgramWrapper *pPVar4;
  SeparateShaderTest *this_03;
  byte bVar5;
  undefined8 in_stack_fffffffffffffef8;
  ResultCollector *this_04;
  undefined4 in_stack_ffffffffffffff00;
  GLint GVar6;
  undefined4 in_stack_ffffffffffffff04;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  GLint local_68;
  GLint local_64;
  GLint queryFrg;
  GLint queryVtx;
  GLuint pipeName;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  local_50;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *local_40;
  Pipeline *local_30;
  Pipeline *pipeline;
  ProgramParams pipePp;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *pipeOut_local;
  SeparateShaderTest *this_local;
  
  pipePp._8_8_ = pipeOut;
  _pipeline = genProgramParams(&this->m_rnd);
  this_03 = this;
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_50,this,(ProgramParams *)&pipeline);
  local_40 = de::details::MovePtr::operator_cast_to_PtrData(&local_50,(MovePtr *)this_03);
  data._8_4_ = in_stack_ffffffffffffff00;
  data.ptr = (Pipeline *)in_stack_fffffffffffffef8;
  data._12_4_ = in_stack_ffffffffffffff04;
  this_00 = &de::details::
             MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
             ::operator=((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                          *)pipePp._8_8_,data)->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ;
  this_01 = de::details::
            UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
            ::operator*(this_00);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
              *)&local_50);
  local_30 = this_01;
  this_02 = de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
            ::operator->((UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                          *)this_01);
  queryFrg = glu::ProgramPipeline::getPipeline(this_02);
  local_64 = 0;
  local_68 = 0;
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    do {
      glu::CallLogWrapper::glGetProgramPipelineiv
                (&this->super_CallLogWrapper,queryFrg,0x8b31,&local_64);
      GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar1,"glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                      ,0x5b9);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
    GVar6 = local_64;
  } while (dVar2 != 0);
  pPVar4 = Pipeline::getVertexProgram(local_30);
  iVar3 = (*pPVar4->_vptr_ProgramWrapper[2])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Program pipeline query reported wrong vertex shader program",
             &local_89);
  tcu::ResultCollector::check(&this->m_status,GVar6 == iVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  do {
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
    do {
      glu::CallLogWrapper::glGetProgramPipelineiv
                (&this->super_CallLogWrapper,queryFrg,0x8b30,&local_68);
      GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(GVar1,"glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                      ,0x5bd);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,false);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  this_04 = &this->m_status;
  GVar6 = local_68;
  pPVar4 = Pipeline::getFragmentProgram(local_30);
  iVar3 = (*pPVar4->_vptr_ProgramWrapper[2])();
  bVar5 = GVar6 == iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Program pipeline query reported wrong fragment shader program",
             &local_b1);
  tcu::ResultCollector::check(this_04,(bool)(bVar5 & 1),&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryPrograms (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLint						queryVtx	= 0;
	GLint						queryFrg	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)));
	m_status.check(GLuint(queryVtx) == pipeline.getVertexProgram().getProgramName(),
				   "Program pipeline query reported wrong vertex shader program");

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)));
	m_status.check(GLuint(queryFrg) == pipeline.getFragmentProgram().getProgramName(),
				   "Program pipeline query reported wrong fragment shader program");
}